

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vk_mem_alloc.h
# Opt level: O3

VkResult __thiscall
VmaDeviceMemoryBlock::WriteMagicValueAfterAllocation
          (VmaDeviceMemoryBlock *this,VmaAllocator hAllocator,VkDeviceSize allocOffset,
          VkDeviceSize allocSize)

{
  VkResult VVar1;
  void *pData;
  void *local_20;
  
  VVar1 = Map(this,hAllocator,1,&local_20);
  if (VVar1 == VK_SUCCESS) {
    Unmap(this,hAllocator,1);
  }
  return VVar1;
}

Assistant:

VkResult VmaDeviceMemoryBlock::WriteMagicValueAfterAllocation(VmaAllocator hAllocator, VkDeviceSize allocOffset, VkDeviceSize allocSize)
{
    VMA_ASSERT(VMA_DEBUG_MARGIN > 0 && VMA_DEBUG_MARGIN % 4 == 0 && VMA_DEBUG_DETECT_CORRUPTION);

    void* pData;
    VkResult res = Map(hAllocator, 1, &pData);
    if (res != VK_SUCCESS)
    {
        return res;
    }

    VmaWriteMagicValue(pData, allocOffset + allocSize);

    Unmap(hAllocator, 1);
    return VK_SUCCESS;
}